

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

KOption getdetails(Header *h,size_t totalsize,char **fmt,size_t *psize,uint *ntoalign)

{
  KOption KVar1;
  KOption KVar2;
  uint uVar3;
  size_t sVar4;
  size_t local_38;
  
  KVar1 = getoption(h,fmt,psize);
  local_38 = *psize;
  sVar4 = local_38;
  if (KVar1 == Kpaddalign) {
    if (**fmt != '\0') {
      KVar2 = getoption(h,fmt,&local_38);
      sVar4 = local_38;
      if (local_38 != 0 && KVar2 != Kchar) goto LAB_0011828c;
    }
    sVar4 = local_38;
    luaL_argerror(h->L,1,"invalid next option for option \'X\'");
  }
LAB_0011828c:
  if (KVar1 == Kchar || sVar4 < 2) {
    *ntoalign = 0;
  }
  else {
    uVar3 = h->maxalign;
    if (sVar4 < uVar3) {
      uVar3 = (uint)sVar4;
    }
    if ((uVar3 & uVar3 - 1) == 0) {
      *ntoalign = uVar3 - ((uint)totalsize & uVar3 - 1) & uVar3 - 1;
    }
    else {
      *ntoalign = 0;
      luaL_argerror(h->L,1,"format asks for alignment not power of 2");
    }
  }
  return KVar1;
}

Assistant:

static KOption getdetails (Header *h, size_t totalsize, const char **fmt,
                           size_t *psize, unsigned *ntoalign) {
  KOption opt = getoption(h, fmt, psize);
  size_t align = *psize;  /* usually, alignment follows size */
  if (opt == Kpaddalign) {  /* 'X' gets alignment from following option */
    if (**fmt == '\0' || getoption(h, fmt, &align) == Kchar || align == 0)
      luaL_argerror(h->L, 1, "invalid next option for option 'X'");
  }
  if (align <= 1 || opt == Kchar)  /* need no alignment? */
    *ntoalign = 0;
  else {
    if (align > h->maxalign)  /* enforce maximum alignment */
      align = h->maxalign;
    if (l_unlikely(!ispow2(align))) {  /* not a power of 2? */
      *ntoalign = 0;  /* to avoid warnings */
      luaL_argerror(h->L, 1, "format asks for alignment not power of 2");
    }
    else {
      /* 'szmoda' = totalsize % align */
      unsigned szmoda = cast_uint(totalsize & (align - 1));
      *ntoalign = cast_uint((align - szmoda) & (align - 1));
    }
  }
  return opt;
}